

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

ssize_t kvtree_read_fd(char *file,int fd,kvtree *hash)

{
  kvtree *local_a0;
  kvtree *tmp_hash;
  uint32_t crc_file;
  uint32_t crc_file_network;
  uLong crc;
  size_t sStack_80;
  int crc_set;
  ssize_t remainder;
  char *buf;
  char *pcStack_68;
  uint32_t flags;
  uint64_t filesize;
  uint16_t version;
  uint16_t type;
  uint32_t magic;
  size_t size;
  ssize_t nread;
  char header [20];
  kvtree *hash_local;
  int fd_local;
  char *file_local;
  
  if (((file == (char *)0x0) || (fd < 0)) || (hash == (kvtree *)0x0)) {
    kvtree_err("Bad file/fd/hash in %s @ %s:%d",file,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
               ,0x536);
    file_local = (char *)0xffffffffffffffff;
  }
  else {
    size = kvtree_read_attempt(file,fd,&nread,0x14);
    if ((long)size < 0) {
      kvtree_err("Failed to read header from %s @ %s:%d",file,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                 ,0x540);
      file_local = (char *)0xffffffffffffffff;
    }
    else if (size == 0) {
      file_local = (char *)0x0;
    }
    else if (size == 0x14) {
      _version = 0;
      kvtree_unpack_uint32_t(&nread,0x14,(size_t *)&version,(uint32_t *)((long)&filesize + 4));
      kvtree_unpack_uint16_t(&nread,0x14,(size_t *)&version,(uint16_t *)((long)&filesize + 2));
      kvtree_unpack_uint16_t(&nread,0x14,(size_t *)&version,(uint16_t *)&filesize);
      if (((filesize._4_4_ == -0x6ae03c0b) && (filesize._2_2_ == 1)) && ((short)filesize == 1)) {
        kvtree_unpack_uint64_t(&nread,0x14,(size_t *)&version,(uint64_t *)&stack0xffffffffffffff98);
        kvtree_unpack_uint32_t(&nread,0x14,(size_t *)&version,(uint32_t *)((long)&buf + 4));
        if (pcStack_68 < (char *)0x14) {
          kvtree_err("Invalid file size stored in %s @ %s:%d",file,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                     ,0x572);
          file_local = (char *)0xffffffffffffffff;
        }
        else {
          remainder = (ssize_t)kvtree_malloc((size_t)pcStack_68,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                                             ,0x578);
          memcpy((void *)remainder,&nread,_version);
          sStack_80 = (long)pcStack_68 - _version;
          if (0 < (long)sStack_80) {
            size = kvtree_read_attempt(file,fd,(void *)(remainder + _version),sStack_80);
            if ((long)size < 0) {
              kvtree_err("Failed to read file %s @ %s:%d",file,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                         ,0x583);
              kvtree_free(&remainder);
              return -1;
            }
            if (size != sStack_80) {
              kvtree_err("Failed to read file %s (read %zu bytes but expected %zu: filesize %zu) @ %s:%d"
                         ,file,size,sStack_80,pcStack_68,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                         ,0x589);
              kvtree_free(&remainder);
              return -1;
            }
          }
          crc._4_4_ = buf._4_4_ & 1;
          if (crc._4_4_ != 0) {
            _crc_file = crc32(0,0,0);
            _crc_file = crc32(_crc_file,remainder,(int)pcStack_68 + -4);
            tmp_hash._4_4_ = *(__uint32_t *)(pcStack_68 + remainder + -4);
            tmp_hash._0_4_ = __bswap_32(tmp_hash._4_4_);
            if (_crc_file != (__uint32_t)tmp_hash) {
              kvtree_err("CRC32 mismatch detected in %s @ %s:%d",file,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                         ,0x5a1);
              kvtree_free(&remainder);
              return -1;
            }
          }
          local_a0 = kvtree_new();
          kvtree_unpack((char *)(remainder + _version),local_a0);
          kvtree_merge(hash,local_a0);
          kvtree_delete(&local_a0);
          kvtree_free(&remainder);
          file_local = pcStack_68;
        }
      }
      else {
        kvtree_err("File header does not match expected values in %s @ %s:%d",file,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                   ,0x562);
        file_local = (char *)0xffffffffffffffff;
      }
    }
    else {
      kvtree_err("Invalid header: read %zu bytes but expected %d in %s @ %s:%d",size,0x14,file,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree.c"
                 ,0x54c);
      file_local = (char *)0xffffffffffffffff;
    }
  }
  return (ssize_t)file_local;
}

Assistant:

ssize_t kvtree_read_fd(const char* file, int fd, kvtree* hash)
{
  /* check that we have a hash, a file name, and a file descriptor */
  if (file == NULL || fd < 0 || hash == NULL) {
    kvtree_err("Bad file/fd/hash in %s @ %s:%d",
      file, __FILE__, __LINE__);
    return -1;
  }

  /* read in the file header */
  char header[KVTREE_FILE_HASH_HEADER_SIZE];
  ssize_t nread = kvtree_read_attempt(file, fd, header, KVTREE_FILE_HASH_HEADER_SIZE);
  if (nread < 0) {
    /* error while reading header */
    kvtree_err("Failed to read header from %s @ %s:%d",
      file, __FILE__, __LINE__);
    return -1;
  }
  if (nread == 0) {
    /* We've got an empty file.  It depends on the situation as to whether this is
     * an error or not.  Do not print an error, and return 0 so someone can test.
     * Any valid, non-empty file will return a positive size. */
    return 0;
  }
  if (nread != KVTREE_FILE_HASH_HEADER_SIZE) {
    /* read something but the expected size does not match */
    kvtree_err("Invalid header: read %zu bytes but expected %d in %s @ %s:%d",
      nread, KVTREE_FILE_HASH_HEADER_SIZE, file, __FILE__, __LINE__);
    return -1;
  }

  /* track our current offset within the read buffer */
  size_t size = 0;

  /* read in the magic number, the type, and the version number */
  uint32_t magic;
  uint16_t type, version;
  kvtree_unpack_uint32_t(header, sizeof(header), &size, &magic);
  kvtree_unpack_uint16_t(header, sizeof(header), &size, &type);
  kvtree_unpack_uint16_t(header, sizeof(header), &size, &version);

  /* check that the magic number matches */
  /* check that the file type is something we understand */
  /* check that the file version matches */
  if (magic   != KVTREE_FILE_MAGIC ||
      type    != KVTREE_FILE_TYPE_HASH ||
      version != KVTREE_FILE_VERSION_HASH_1)
  {
    kvtree_err("File header does not match expected values in %s @ %s:%d",
      file, __FILE__, __LINE__
    );
    return -1;
  }

  /* read the file size */
  uint64_t filesize;
  kvtree_unpack_uint64_t(header, sizeof(header), &size, &filesize);

  /* read the flags field (32 bits) */
  uint32_t flags;
  kvtree_unpack_uint32_t(header, sizeof(header), &size, &flags);

  /* check that the filesize is valid (positive) */
  if (filesize < KVTREE_FILE_HASH_HEADER_SIZE) {
    kvtree_err("Invalid file size stored in %s @ %s:%d",
      file, __FILE__, __LINE__
    );
    return -1;
  }

  /* allocate a buffer to read the hash and crc */
  char* buf = (char*) KVTREE_MALLOC(filesize);

  /* copy the header into the buffer */
  memcpy(buf, header, size);

  /* read the rest of the file into the buffer */
  ssize_t remainder = filesize - size;
  if (remainder > 0) {
    nread = kvtree_read_attempt(file, fd, buf + size, remainder);
    if (nread < 0) {
      kvtree_err("Failed to read file %s @ %s:%d",
        file, __FILE__, __LINE__);
      kvtree_free(&buf);
      return -1;
    }
    if (nread != remainder) {
      kvtree_err("Failed to read file %s (read %zu bytes but expected %zu: filesize %zu) @ %s:%d",
        file, nread, remainder, filesize, __FILE__, __LINE__);
      kvtree_free(&buf);
      return -1;
    }
  }

  /* check the crc value if it's set */
  int crc_set = flags & KVTREE_FILE_FLAGS_CRC32;
  if (crc_set) {
    /* TODO: we should check that the remainder above is at least 4
     * (for the crc) */

    /* compute the crc value of the data */
    uLong crc = crc32(0L, Z_NULL, 0);
    crc = crc32(crc, (const Bytef*) buf, (uInt) filesize - sizeof(uint32_t));

    /* read the crc value */
    uint32_t crc_file_network, crc_file;
    memcpy(&crc_file_network, buf + filesize - sizeof(uint32_t), sizeof(uint32_t));
    crc_file = kvtree_ntoh32(crc_file_network);

    /* check the crc value */
    if (crc != crc_file) {
      kvtree_err("CRC32 mismatch detected in %s @ %s:%d",
        file, __FILE__, __LINE__
      );
      kvtree_free(&buf);
      return -1;
    }
  }

  /* create a temporary hash to read data into, unpack, and merge */
  kvtree* tmp_hash = kvtree_new();
  kvtree_unpack(buf + size, tmp_hash);
  kvtree_merge(hash, tmp_hash);
  kvtree_delete(&tmp_hash);

  /* free the buffer holding the file contents */
  kvtree_free(&buf);

  return filesize;
}